

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O3

SObjMtl * __thiscall
irr::scene::COBJMeshFileLoader::findMtl(COBJMeshFileLoader *this,stringc *mtlName,stringc *grpName)

{
  undefined1 *this_00;
  bool bVar1;
  SObjMtl *pSVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  SObjMtl *local_48;
  SObjMtl *local_38;
  
  this_00 = &(this->super_IMeshLoader).field_0x10;
  puVar3 = *(undefined8 **)&(this->super_IMeshLoader).field_0x10;
  if ((int)((ulong)(*(long *)&(this->super_IMeshLoader).field_0x18 - (long)puVar3) >> 3) != 0) {
    lVar5 = 0;
    uVar4 = 0;
    local_48 = (SObjMtl *)0x0;
    do {
      bVar1 = core::string<char>::operator==
                        ((string<char> *)(*(long *)((long)puVar3 + lVar5) + 0x38),mtlName);
      puVar3 = *(undefined8 **)this_00;
      if (bVar1) {
        bVar1 = core::string<char>::operator==
                          ((string<char> *)(*(long *)((long)puVar3 + lVar5) + 0x58),grpName);
        puVar3 = *(undefined8 **)this_00;
        if (bVar1) {
          puVar3 = (undefined8 *)((long)puVar3 + lVar5);
          goto LAB_001b416a;
        }
        local_48 = *(SObjMtl **)((long)puVar3 + lVar5);
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar4 < ((ulong)(*(long *)&(this->super_IMeshLoader).field_0x18 - (long)puVar3) >> 3 &
                     0xffffffff));
    if (local_48 != (SObjMtl *)0x0) {
      pSVar2 = (SObjMtl *)operator_new(0x80);
      goto LAB_001b412b;
    }
  }
  if ((int)(grpName->str)._M_string_length == 0) {
    return (SObjMtl *)0x0;
  }
  pSVar2 = (SObjMtl *)operator_new(0x80);
  local_48 = (SObjMtl *)*puVar3;
LAB_001b412b:
  SObjMtl::SObjMtl(pSVar2,local_48);
  local_38 = pSVar2;
  ::std::
  vector<irr::scene::COBJMeshFileLoader::SObjMtl*,std::allocator<irr::scene::COBJMeshFileLoader::SObjMtl*>>
  ::emplace_back<irr::scene::COBJMeshFileLoader::SObjMtl*>
            ((vector<irr::scene::COBJMeshFileLoader::SObjMtl*,std::allocator<irr::scene::COBJMeshFileLoader::SObjMtl*>>
              *)this_00,&local_38);
  this->field_0x28 = 0;
  pSVar2 = *(SObjMtl **)(*(long *)&(this->super_IMeshLoader).field_0x18 + -8);
  if (&pSVar2->Group != grpName) {
    ::std::__cxx11::string::_M_assign((string *)&pSVar2->Group);
    puVar3 = (undefined8 *)(*(long *)&(this->super_IMeshLoader).field_0x18 + -8);
LAB_001b416a:
    pSVar2 = (SObjMtl *)*puVar3;
  }
  return pSVar2;
}

Assistant:

COBJMeshFileLoader::SObjMtl *COBJMeshFileLoader::findMtl(const core::stringc &mtlName, const core::stringc &grpName)
{
	COBJMeshFileLoader::SObjMtl *defMaterial = 0;
	// search existing Materials for best match
	// exact match does return immediately, only name match means a new group
	for (u32 i = 0; i < Materials.size(); ++i) {
		if (Materials[i]->Name == mtlName) {
			if (Materials[i]->Group == grpName)
				return Materials[i];
			else
				defMaterial = Materials[i];
		}
	}
	// we found a partial match
	if (defMaterial) {
		Materials.push_back(new SObjMtl(*defMaterial));
		Materials.getLast()->Group = grpName;
		return Materials.getLast();
	}
	// we found a new group for a non-existent material
	else if (grpName.size()) {
		Materials.push_back(new SObjMtl(*Materials[0]));
		Materials.getLast()->Group = grpName;
		return Materials.getLast();
	}
	return 0;
}